

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::flags_internal::FlagImpl::StoreValue
          (FlagImpl *this,void *src,ValueSource source)

{
  MaskedPointer MVar1;
  FlagValueStorageKind FVar2;
  bool bVar3;
  atomic<long> *paVar4;
  atomic<unsigned_long> *dst;
  size_t sVar5;
  atomic<absl::lts_20240722::flags_internal::MaskedPointer> *paVar6;
  void *pvVar7;
  MaskedPointer local_70;
  MaskedPointer local_68;
  MaskedPointer ptr_value;
  int64_t one_word_val;
  ValueSource source_local;
  void *src_local;
  FlagImpl *this_local;
  memory_order __b_1;
  memory_order __b;
  
  FVar2 = ValueStorageKind(this);
  if (FVar2 < kSequenceLocked) {
    paVar4 = OneWordValue(this);
    std::operator&(memory_order_acquire,__memory_order_mask);
    ptr_value.ptr_ = (ptr_t)(paVar4->super___atomic_base<long>)._M_i;
    sVar5 = Sizeof(this->op_);
    memcpy(&ptr_value,src,sVar5);
    paVar4 = OneWordValue(this);
    MVar1 = ptr_value;
    std::operator&(memory_order_release,__memory_order_mask);
    (paVar4->super___atomic_base<long>)._M_i = (__int_type)MVar1.ptr_;
    SequenceLock::IncrementModificationCount(&this->seq_lock_);
  }
  else if (FVar2 == kSequenceLocked) {
    dst = AtomicBufferValue(this);
    sVar5 = Sizeof(this->op_);
    SequenceLock::Write(&this->seq_lock_,dst,src,sVar5);
  }
  else if (FVar2 == kHeapAllocated) {
    paVar6 = PtrStorage(this);
    local_68 = std::atomic<absl::lts_20240722::flags_internal::MaskedPointer>::load
                         (paVar6,memory_order_acquire);
    bVar3 = MaskedPointer::IsUnprotectedReadCandidate(&local_68);
    if ((bVar3) && (bVar3 = MaskedPointer::HasBeenRead(&local_68), bVar3)) {
      pvVar7 = MaskedPointer::Ptr(&local_68);
      anon_unknown_0::AddToFreelist(pvVar7);
      pvVar7 = Clone(this->op_,src);
      MaskedPointer::MaskedPointer(&local_70,pvVar7,source == kCommandLine);
      local_68.ptr_ = local_70.ptr_;
    }
    else {
      MaskedPointer::Set(&local_68,this->op_,src,source == kCommandLine);
    }
    paVar6 = PtrStorage(this);
    std::atomic<absl::lts_20240722::flags_internal::MaskedPointer>::store
              (paVar6,local_68,memory_order_release);
    SequenceLock::IncrementModificationCount(&this->seq_lock_);
  }
  this->field_0x29 = this->field_0x29 & 0xfb | 4;
  InvokeCallback(this);
  return;
}

Assistant:

void FlagImpl::StoreValue(const void* src, ValueSource source) {
  switch (ValueStorageKind()) {
    case FlagValueStorageKind::kValueAndInitBit:
    case FlagValueStorageKind::kOneWordAtomic: {
      // Load the current value to avoid setting 'init' bit manually.
      int64_t one_word_val = OneWordValue().load(std::memory_order_acquire);
      std::memcpy(&one_word_val, src, Sizeof(op_));
      OneWordValue().store(one_word_val, std::memory_order_release);
      seq_lock_.IncrementModificationCount();
      break;
    }
    case FlagValueStorageKind::kSequenceLocked: {
      seq_lock_.Write(AtomicBufferValue(), src, Sizeof(op_));
      break;
    }
    case FlagValueStorageKind::kHeapAllocated:
      MaskedPointer ptr_value = PtrStorage().load(std::memory_order_acquire);

      if (ptr_value.IsUnprotectedReadCandidate() && ptr_value.HasBeenRead()) {
        // If current value is a candidate for an unprotected read and if it was
        // already read at least once, follow up reads (if any) are done without
        // mutex protection. We can't guarantee it is safe to reuse this memory
        // since it may have been accessed by another thread concurrently, so
        // instead we move the memory to a freelist so it can still be safely
        // accessed, and allocate a new one for the new value.
        AddToFreelist(ptr_value.Ptr());
        ptr_value = MaskedPointer(Clone(op_, src), source == kCommandLine);
      } else {
        // Current value either was set programmatically or was never read.
        // We can reuse the memory since all accesses to this value (if any)
        // were protected by mutex. That said, if a new value comes from command
        // line it now becomes a candidate for an unprotected read.
        ptr_value.Set(op_, src, source == kCommandLine);
      }

      PtrStorage().store(ptr_value, std::memory_order_release);
      seq_lock_.IncrementModificationCount();
      break;
  }
  modified_ = true;
  InvokeCallback();
}